

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deThreadTest.c
# Opt level: O3

void deThread_selfTest(void)

{
  deBool dVar1;
  deThread dVar2;
  deThreadLocal threadLocal;
  void *pvVar3;
  long lVar4;
  long in_FS_OFFSET;
  deInt32 val;
  deThreadLocal local_38 [3];
  
  deSleep(0);
  deSleep(100);
  deYield();
  local_38[0] = CONCAT44(local_38[0]._4_4_,0x7b);
  dVar2 = deThread_create(threadTestThr1,local_38,(deThreadAttributes *)0x0);
  if (dVar2 == 0) {
    deAssertFail("thread",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/dethread/deThreadTest.c"
                 ,0x61);
  }
  dVar1 = deThread_join(dVar2);
  if (dVar1 == 0) {
    deAssertFail("ret",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/dethread/deThreadTest.c"
                 ,100);
  }
  deThread_destroy(dVar2);
  dVar2 = deThread_create(threadTestThr2,(void *)0x0,(deThreadAttributes *)0x0);
  if (dVar2 == 0) {
    deAssertFail("thread",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/dethread/deThreadTest.c"
                 ,0x6d);
  }
  dVar1 = deThread_join(dVar2);
  if (dVar1 == 0) {
    deAssertFail("ret",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/dethread/deThreadTest.c"
                 ,0x70);
  }
  deThread_destroy(dVar2);
  local_38[0] = 0;
  local_38[1] = 0;
  dVar2 = deThread_create(threadTestThr3,local_38,(deThreadAttributes *)0x0);
  if (dVar2 == 0) {
    deAssertFail("thread",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/dethread/deThreadTest.c"
                 ,0x7f);
  }
  dVar1 = deThread_join(dVar2);
  if (dVar1 == 0) {
    deAssertFail("ret",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/dethread/deThreadTest.c"
                 ,0x82);
  }
  lVar4 = 0;
  do {
    if (*(char *)((long)local_38 + lVar4) != -1) {
      deAssertFail("data.bytes[ndx] == 0xff",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/dethread/deThreadTest.c"
                   ,0x85);
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x10);
  deThread_destroy(dVar2);
  threadLocal = deThreadLocal_create();
  local_38[0] = threadLocal;
  if (threadLocal == 0) {
    deAssertFail("tls",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/dethread/deThreadTest.c"
                 ,0x90);
  }
  deThreadLocal_set(threadLocal,(void *)0xff);
  dVar2 = deThread_create(threadTestThr4,local_38,(deThreadAttributes *)0x0);
  deThread_join(dVar2);
  deThread_destroy(dVar2);
  pvVar3 = deThreadLocal_get(local_38[0]);
  if (pvVar3 != (void *)0xff) {
    deAssertFail("(deUintptr)deThreadLocal_get(tls) == 0xff",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/dethread/deThreadTest.c"
                 ,0x98);
  }
  deThreadLocal_destroy(local_38[0]);
  if (*(int *)(in_FS_OFFSET + -4) != 0x7b) {
    deAssertFail("tls_testVar == 123",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/dethread/deThreadTest.c"
                 ,0xa0);
  }
  *(undefined4 *)(in_FS_OFFSET + -4) = 1;
  dVar2 = deThread_create(tlsTestThr,(void *)0x0,(deThreadAttributes *)0x0);
  deThread_join(dVar2);
  deThread_destroy(dVar2);
  if (*(int *)(in_FS_OFFSET + -4) != 1) {
    deAssertFail("tls_testVar == 1",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/dethread/deThreadTest.c"
                 ,0xa8);
  }
  *(undefined4 *)(in_FS_OFFSET + -4) = 0x7b;
  return;
}

Assistant:

void deThread_selfTest (void)
{
	/* Test sleep & yield. */
	deSleep(0);
	deSleep(100);
	deYield();

	/* Thread test 1. */
	{
		deInt32		val		= 123;
		deBool		ret;
		deThread	thread	= deThread_create(threadTestThr1, &val, DE_NULL);
		DE_TEST_ASSERT(thread);

		ret = deThread_join(thread);
		DE_TEST_ASSERT(ret);

		deThread_destroy(thread);
	}

	/* Thread test 2. */
	{
		deThread	thread	= deThread_create(threadTestThr2, DE_NULL, DE_NULL);
		deInt32		ret;
		DE_TEST_ASSERT(thread);

		ret = deThread_join(thread);
		DE_TEST_ASSERT(ret);

		deThread_destroy(thread);
	}

	/* Thread test 3. */
	{
		ThreadData3	data;
		deThread	thread;
		deBool		ret;
		int			ndx;

		deMemset(&data, 0, sizeof(ThreadData3));

		thread = deThread_create(threadTestThr3, &data, DE_NULL);
		DE_TEST_ASSERT(thread);

		ret = deThread_join(thread);
		DE_TEST_ASSERT(ret);

		for (ndx = 0; ndx < (int)DE_LENGTH_OF_ARRAY(data.bytes); ndx++)
			DE_TEST_ASSERT(data.bytes[ndx] == 0xff);

		deThread_destroy(thread);
	}

	/* Test tls. */
	{
		deThreadLocal	tls;
		deThread		thread;

		tls = deThreadLocal_create();
		DE_TEST_ASSERT(tls);

		deThreadLocal_set(tls, (void*)(deUintptr)0xff);

		thread = deThread_create(threadTestThr4, &tls, DE_NULL);
		deThread_join(thread);
		deThread_destroy(thread);

		DE_TEST_ASSERT((deUintptr)deThreadLocal_get(tls) == 0xff);
		deThreadLocal_destroy(tls);
	}

#if defined(DE_THREAD_LOCAL)
	{
		deThread thread;

		DE_TEST_ASSERT(tls_testVar == 123);
		tls_testVar = 1;
		DE_TEST_ASSERT(tls_testVar == 1);

		thread = deThread_create(tlsTestThr, DE_NULL, DE_NULL);
		deThread_join(thread);
		deThread_destroy(thread);

		DE_TEST_ASSERT(tls_testVar == 1);
		tls_testVar = 123;
	}
#endif
}